

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O1

void __thiscall OrgData::PlayData(OrgData *this)

{
  byte key;
  uchar pan;
  long lVar1;
  int i;
  uint uVar2;
  NOTELIST *pNVar3;
  char track;
  long lVar4;
  long lVar5;
  OrgData *pOVar6;
  TRACKDATA *pTVar7;
  int *piVar8;
  
  if (Volume != 0 && bFadeout) {
    Volume = Volume + -2;
  }
  if (Volume < 0) {
    Volume = 0;
  }
  pTVar7 = (this->info).tdata;
  piVar8 = TrackVol;
  lVar5 = 0;
  lVar4 = 0;
  pOVar6 = this;
  do {
    lVar1 = *(long *)((long)np + lVar5);
    track = (char)lVar4;
    if ((lVar1 != 0) && (PlayPos == *(long *)(lVar1 + 0x10))) {
      if ((g_mute[lVar4] == false) && (key = *(byte *)(lVar1 + 0x19), key != 0xff)) {
        pOVar6 = (OrgData *)(ulong)key;
        PlayOrganObject(key,-1,track,(ulong)pTVar7->freq);
        *(ulong *)((long)now_leng + lVar5) = (ulong)*(byte *)(*(long *)((long)np + lVar5) + 0x18);
      }
      pan = *(uchar *)(*(long *)((long)np + lVar5) + 0x1b);
      if (pan != 0xff) {
        pOVar6 = (OrgData *)0x0;
        ChangeOrganPan('\0',pan,track);
      }
      lVar1 = *(long *)((long)np + lVar5);
      uVar2 = (uint)*(byte *)(lVar1 + 0x1a);
      if (uVar2 != 0xff) {
        *piVar8 = uVar2;
      }
      *(undefined8 *)((long)np + lVar5) = *(undefined8 *)(lVar1 + 8);
    }
    if (*(long *)((long)now_leng + lVar5) == 0) {
      pOVar6 = (OrgData *)0x0;
      PlayOrganObject('\0',2,track,(ulong)pTVar7->freq);
    }
    if (0 < *(long *)((long)now_leng + lVar5)) {
      *(long *)((long)now_leng + lVar5) = *(long *)((long)now_leng + lVar5) + -1;
    }
    if (*(long *)((long)np + lVar5) != 0) {
      ChangeOrganVolume((int)pOVar6,(long)((Volume * *piVar8) / 0x7f),track);
    }
    lVar4 = lVar4 + 1;
    piVar8 = (int *)((uint *)piVar8 + 1);
    pTVar7 = pTVar7 + 1;
    lVar5 = lVar5 + 8;
  } while (lVar4 != 8);
  lVar4 = 0;
  do {
    pNVar3 = np[lVar4 + 8];
    if ((pNVar3 != (NOTELIST *)0x0) && (PlayPos == pNVar3->x)) {
      if ((pNVar3->y != 0xff) && (g_mute[lVar4 + 8] == false)) {
        PlayDramObject(pNVar3->y,1,(char)lVar4);
      }
      if (np[lVar4 + 8]->pan != 0xff) {
        ChangeDramPan(np[lVar4 + 8]->pan,(char)lVar4);
      }
      pNVar3 = np[lVar4 + 8];
      uVar2 = (uint)pNVar3->volume;
      if (uVar2 != 0xff) {
        TrackVol[lVar4 + 8] = uVar2;
      }
      np[lVar4 + 8] = pNVar3->to;
    }
    if ((np[lVar4 + 8] != (NOTELIST *)0x0) && (audio_backend_initialised == true)) {
      AudioBackend_SetSoundVolume
                (lpSECONDARYBUFFER[lVar4 + 0x96],
                 (long)((Volume * TrackVol[lVar4 + 8]) / 0x7f) * 8 + -0x7f8);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  PlayPos = PlayPos + 1;
  if ((this->info).end_x <= PlayPos) {
    PlayPos = (this->info).repeat_x;
    lVar4 = 0;
    do {
      for (pNVar3 = (this->info).tdata[lVar4].note_list;
          (np[lVar4] = pNVar3, pNVar3 != (NOTELIST *)0x0 && (pNVar3->x < PlayPos));
          pNVar3 = pNVar3->to) {
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
  }
  return;
}

Assistant:

void OrgData::PlayData(void)
{
	int i;

	// Handle fading out
	if (bFadeout && Volume)
		Volume -= 2;
	if (Volume < 0)
		Volume = 0;

	// メロディの再生 (Play melody)
	for (i = 0; i < MAXMELODY; i++)
	{
		if (np[i] != NULL && PlayPos == np[i]->x)
		{
			if (!g_mute[i] && np[i]->y != KEYDUMMY)	// 音が来た。 (The sound has come.)
			{
				PlayOrganObject(np[i]->y, -1, i, info.tdata[i].freq);
				now_leng[i] = np[i]->length;
			}

			if (np[i]->pan != PANDUMMY)
				ChangeOrganPan(np[i]->y, np[i]->pan, i);
			if (np[i]->volume != VOLDUMMY)
				TrackVol[i] = np[i]->volume;

			np[i] = np[i]->to;	// 次の音符を指す (Points to the next note)
		}

		if (now_leng[i] == 0)
			PlayOrganObject(0, 2, i, info.tdata[i].freq);

		if (now_leng[i] > 0)
			now_leng[i]--;

		if (np[i])
			ChangeOrganVolume(np[i]->y, TrackVol[i] * Volume / 0x7F, i);
	}

	// ドラムの再生 (Drum playback)
	for (i = MAXMELODY; i < MAXTRACK; i++)
	{
		if (np[i] != NULL && PlayPos == np[i]->x)	// 音が来た。 (The sound has come.)
		{
			if (np[i]->y != KEYDUMMY && !g_mute[i])	// ならす (Tame)
				PlayDramObject(np[i]->y, 1, i - MAXMELODY);

			if (np[i]->pan != PANDUMMY)
				ChangeDramPan(np[i]->pan, i - MAXMELODY);
			if (np[i]->volume != VOLDUMMY)
				TrackVol[i] = np[i]->volume;

			np[i] = np[i]->to;	// 次の音符を指す (Points to the next note)
		}

		if (np[i])
			ChangeDramVolume(TrackVol[i] * Volume / 0x7F, i - MAXMELODY);
	}

	// Looping
	PlayPos++;
	if (PlayPos >= info.end_x)
	{
		PlayPos = info.repeat_x;
		SetPlayPointer(PlayPos);
	}
}